

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuinfo.cpp
# Opt level: O0

void asmjit::v1_14::x86::xgetbvQuery(xgetbv_t *out,uint32_t inEcx)

{
  uint32_t in_XCR0;
  uint32_t in_register_00000604;
  uint32_t outEdx;
  uint32_t outEax;
  uint32_t inEcx_local;
  xgetbv_t *out_local;
  
  out->eax = in_XCR0;
  out->edx = in_register_00000604;
  return;
}

Assistant:

static inline void xgetbvQuery(xgetbv_t* out, uint32_t inEcx) noexcept {
#if defined(_MSC_VER)
  uint64_t value = _xgetbv(inEcx);
  out->eax = uint32_t(value & 0xFFFFFFFFu);
  out->edx = uint32_t(value >> 32);
#elif defined(__GNUC__)
  uint32_t outEax;
  uint32_t outEdx;

  // Replaced, because the world is not perfect:
  //   __asm__ __volatile__("xgetbv" : "=a"(outEax), "=d"(outEdx) : "c"(inEcx));
  __asm__ __volatile__(".byte 0x0F, 0x01, 0xD0" : "=a"(outEax), "=d"(outEdx) : "c"(inEcx));

  out->eax = outEax;
  out->edx = outEdx;
#else
  out->eax = 0;
  out->edx = 0;
#endif
}